

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O0

int gray_raster_render(gray_PRaster raster,SW_FT_Raster_Params *params)

{
  undefined8 *in_RSI;
  int band_size;
  long buffer_size;
  TCell buffer [512];
  gray_TWorker worker [1];
  SW_FT_Outline *outline;
  undefined1 local_5098 [752];
  gray_PWorker in_stack_ffffffffffffb258;
  gray_TWorker_ local_1098;
  short *local_20;
  undefined8 *local_18;
  int local_4;
  
  local_20 = (short *)*in_RSI;
  if (local_20 == (short *)0x0) {
    local_4 = -1;
  }
  else if ((local_20[1] == 0) || (*local_20 < 1)) {
    local_4 = 0;
  }
  else if ((*(long *)(local_20 + 0xc) == 0) || (*(long *)(local_20 + 4) == 0)) {
    local_4 = -1;
  }
  else if ((int)local_20[1] ==
           *(short *)(*(long *)(local_20 + 0xc) + (long)(*local_20 + -1) * 2) + 1) {
    if ((*(uint *)(in_RSI + 1) & 1) == 0) {
      local_4 = -2;
    }
    else {
      if ((*(uint *)(in_RSI + 1) & 4) == 0) {
        local_1098.clip_box.xMin = -0x8000;
        local_1098.clip_box.yMin = -0x8000;
        local_1098.clip_box.xMax = 0x7fff;
        local_1098.clip_box.yMax = 0x7fff;
      }
      else {
        local_1098.clip_box.xMin = in_RSI[5];
        local_1098.clip_box.yMin = in_RSI[6];
        local_1098.clip_box.xMax = in_RSI[7];
        local_1098.clip_box.yMax = in_RSI[8];
      }
      local_18 = in_RSI;
      gray_init_cells(&local_1098,local_5098,0x4000);
      memcpy(&local_1098.outline,local_20,0x30);
      local_1098.num_cells = 0;
      local_1098.invalid = 1;
      local_1098.num_gray_spans = 0;
      local_1098.render_span = (SW_FT_SpanFunc)local_18[2];
      local_1098.render_span_data = (void *)local_18[4];
      local_1098.band_size = 0x40;
      gray_convert_glyph(in_stack_ffffffffffffb258);
      (*(code *)local_18[3])
                (local_1098.bound_left,local_1098.bound_top,
                 local_1098.bound_right - local_1098.bound_left,
                 (local_1098.bound_bottom - local_1098.bound_top) + 1,local_18[4]);
      local_4 = 1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int gray_raster_render(gray_PRaster               raster,
                              const SW_FT_Raster_Params* params)
{
    SW_FT_UNUSED(raster);
    const SW_FT_Outline* outline = (const SW_FT_Outline*)params->source;

    gray_TWorker worker[1];

    TCell buffer[SW_FT_RENDER_POOL_SIZE / sizeof(TCell)];
    long  buffer_size = sizeof(buffer);
    int   band_size = (int)(buffer_size / (long)(sizeof(TCell) * 8));

    if (!outline) return SW_FT_THROW(Invalid_Outline);

    /* return immediately if the outline is empty */
    if (outline->n_points == 0 || outline->n_contours <= 0) return 0;

    if (!outline->contours || !outline->points)
        return SW_FT_THROW(Invalid_Outline);

    if (outline->n_points != outline->contours[outline->n_contours - 1] + 1)
        return SW_FT_THROW(Invalid_Outline);

    /* this version does not support monochrome rendering */
    if (!(params->flags & SW_FT_RASTER_FLAG_AA))
        return SW_FT_THROW(Invalid_Mode);

    if (params->flags & SW_FT_RASTER_FLAG_CLIP)
        ras.clip_box = params->clip_box;
    else {
        ras.clip_box.xMin = -32768L;
        ras.clip_box.yMin = -32768L;
        ras.clip_box.xMax = 32767L;
        ras.clip_box.yMax = 32767L;
    }

    gray_init_cells(RAS_VAR_ buffer, buffer_size);

    ras.outline = *outline;
    ras.num_cells = 0;
    ras.invalid = 1;
    ras.band_size = band_size;
    ras.num_gray_spans = 0;

    ras.render_span = (SW_FT_Raster_Span_Func)params->gray_spans;
    ras.render_span_data = params->user;

    gray_convert_glyph(RAS_VAR);
    params->bbox_cb(ras.bound_left, ras.bound_top,
                    ras.bound_right - ras.bound_left,
                    ras.bound_bottom - ras.bound_top + 1, params->user);
    return 1;
}